

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitwriter.h
# Opt level: O1

void aom_write_symbol(aom_writer *w,int symb,aom_cdf_prob *cdf,int nsymbs)

{
  ushort uVar1;
  ushort uVar2;
  short sVar3;
  byte bVar4;
  ulong uVar5;
  ulong uVar6;
  
  od_ec_encode_cdf_q15(&w->ec,symb,cdf,nsymbs);
  if (w->allow_update_cdf != '\0') {
    uVar1 = cdf[nsymbs];
    bVar4 = (char)(uVar1 >> 4) + (3 < nsymbs) + 4;
    uVar5 = 1;
    if (1 < (int)(nsymbs - 1U)) {
      uVar5 = (ulong)(nsymbs - 1U);
    }
    uVar6 = 0;
    do {
      uVar2 = cdf[uVar6];
      if ((long)uVar6 < (long)(char)symb) {
        sVar3 = (short)((int)(0x8000 - (uint)uVar2) >> (bVar4 & 0x1f));
      }
      else {
        sVar3 = -(uVar2 >> (bVar4 & 0x1f));
      }
      cdf[uVar6] = sVar3 + uVar2;
      uVar6 = uVar6 + 1;
    } while (uVar5 != uVar6);
    cdf[nsymbs] = cdf[nsymbs] + (ushort)(uVar1 < 0x20);
  }
  return;
}

Assistant:

static inline void aom_write_symbol(aom_writer *w, int symb, aom_cdf_prob *cdf,
                                    int nsymbs) {
  aom_write_cdf(w, symb, cdf, nsymbs);
  if (w->allow_update_cdf) update_cdf(cdf, symb, nsymbs);
}